

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall
ON_SerialNumberMap::RemoveSerialNumberAndId(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  uint uVar1;
  ON_SN_BLOCK *pOVar2;
  ON_SN_BLOCK *pOVar3;
  SN_ELEMENT *e;
  ON__UINT64 OVar4;
  uint uVar5;
  
  e = FindElementHelper(this,sn);
  if ((e == (SN_ELEMENT *)0x0) || (e->m_sn_active == '\0')) {
    e = (SN_ELEMENT *)0x0;
  }
  else {
    Internal_HashTableRemoveElement(this,e,true);
    e->m_sn_active = '\0';
    pOVar2 = this->m_e_blk;
    OVar4 = this->m_sn_purged + 1;
    this->m_sn_purged = OVar4;
    uVar1 = pOVar2->m_count;
    uVar5 = pOVar2->m_purged + 1;
    pOVar2->m_purged = uVar5;
    if (uVar1 == uVar5) {
      pOVar3 = this->m_sn_block0;
      if (pOVar2 == pOVar3) {
        uVar1 = pOVar3->m_count;
        this->m_sn_count = this->m_sn_count - (ulong)uVar1;
        this->m_sn_purged = OVar4 - uVar1;
        pOVar3->m_count = 0;
        pOVar3->m_purged = 0;
        pOVar3->m_sorted = 1;
        pOVar3->m_sn0 = 0;
        pOVar3->m_sn1 = 0;
      }
      else if (1 < uVar1) {
        this->m_sn_count = this->m_sn_count - (ulong)(uVar1 - 1);
        this->m_sn_purged = OVar4 - (uVar1 - 1);
        pOVar2->m_count = 1;
        pOVar2->m_purged = 1;
        OVar4 = pOVar2->m_sn[0].m_sn;
        pOVar2->m_sn1 = OVar4;
        pOVar2->m_sn0 = OVar4;
      }
    }
  }
  return e;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* 
ON_SerialNumberMap::RemoveSerialNumberAndId(ON__UINT64 sn)
{
  struct SN_ELEMENT* e = FindElementHelper(sn);
  if ( e && e->m_sn_active )
  {
    Internal_HashTableRemoveElement(e,true);

    e->m_sn_active = 0;
    m_sn_purged++;
    if ( m_e_blk->m_count == ++m_e_blk->m_purged )
    {
      // every item in the block is purged
      if ( m_e_blk == &m_sn_block0 )
      {
        // Every element in m_sn_block0 is purged.
        // Empty m_sn_block0.
        m_sn_count -= m_sn_block0.m_count;
        m_sn_purged -= m_sn_block0.m_count;
        m_sn_block0.EmptyBlock();
      }
      else if ( m_e_blk->m_count > 1 )
      {
        // m_e_blk is in m_sn_list[] and every element
        // in m_e_blk is purged. Remove all but
        // except one of these elements.
        // Note: We cannot empty blocks in the m_sn_list[] because
        //       this class has code that assumes the blocks
        //       in m_sn_list[] have m_count >= 1.  This makes
        //       the class generally faster.  There is code in 
        //       FindElementHelper() the keeps the m_sn_list[]
        //       blocks relatively tidy.
        m_sn_count  -= (m_e_blk->m_count-1);
        m_sn_purged -= (m_e_blk->m_count-1);
        m_e_blk->m_count = 1;
        m_e_blk->m_purged = 1;
        m_e_blk->m_sn0 = m_e_blk->m_sn1 = m_e_blk->m_sn[0].m_sn;
      }
    }
    return e;
  }

  return 0;
}